

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O2

void * __thiscall amrex::CArena::alloc(CArena *this,size_t nbytes)

{
  NL *this_00;
  _Rb_tree_header *__pos;
  _Base_ptr p_Var1;
  const_iterator __pos_00;
  _Base_ptr p_Var2;
  _Base_ptr nbytes_00;
  Node freeblock;
  Node local_48;
  
  std::mutex::lock(&this->carena_mutex);
  p_Var1 = (_Base_ptr)Arena::align(nbytes + (nbytes == 0));
  if ((this->super_Arena).arena_info.release_threshold <=
      (long)((long)&p_Var1->_M_color + this->m_used)) {
    freeUnused_protected(this);
  }
  this_00 = &this->m_freelist;
  __pos_00._M_node = (this->m_freelist)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __pos = &(this->m_freelist)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)__pos_00._M_node == __pos) {
      nbytes_00 = (_Base_ptr)this->m_hunk;
      if ((_Base_ptr)this->m_hunk < p_Var1) {
        nbytes_00 = p_Var1;
      }
      p_Var2 = (_Base_ptr)Arena::allocate_system(&this->super_Arena,(size_t)nbytes_00);
      this->m_used = (long)&nbytes_00->_M_color + this->m_used;
      local_48.m_block = p_Var2;
      local_48.m_owner = nbytes_00;
      std::vector<std::pair<void*,unsigned_long>,std::allocator<std::pair<void*,unsigned_long>>>::
      emplace_back<std::pair<void*,unsigned_long>>
                ((vector<std::pair<void*,unsigned_long>,std::allocator<std::pair<void*,unsigned_long>>>
                  *)&this->m_alloc,(pair<void_*,_unsigned_long> *)&local_48);
      local_48.m_size = (long)this->m_hunk - (long)p_Var1;
      if (p_Var1 <= (_Base_ptr)this->m_hunk && local_48.m_size != 0) {
        local_48.m_block = (void *)((long)&p_Var1->_M_color + (long)&p_Var2->_M_color);
        local_48.m_owner = p_Var2;
        std::
        _Rb_tree<amrex::CArena::Node,_amrex::CArena::Node,_std::_Identity<amrex::CArena::Node>,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
        ::_M_insert_unique_<amrex::CArena::Node>(&this_00->_M_t,(const_iterator)__pos,&local_48);
      }
      local_48.m_block = p_Var2;
      local_48.m_owner = p_Var2;
      local_48.m_size = (size_t)p_Var1;
      std::__detail::
      _Insert<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->m_busylist,&local_48);
LAB_00504f05:
      this->m_actually_used = (long)&p_Var1->_M_color + this->m_actually_used;
      pthread_mutex_unlock((pthread_mutex_t *)&this->carena_mutex);
      return p_Var2;
    }
    if (p_Var1 <= __pos_00._M_node[1]._M_left) {
      p_Var2 = *(_Base_ptr *)(__pos_00._M_node + 1);
      local_48.m_owner = __pos_00._M_node[1]._M_parent;
      local_48.m_block = p_Var2;
      local_48.m_size = (size_t)p_Var1;
      std::__detail::
      _Insert<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&this->m_busylist,&local_48);
      if (p_Var1 < __pos_00._M_node[1]._M_left) {
        local_48.m_owner = __pos_00._M_node[1]._M_parent;
        local_48.m_size = (long)__pos_00._M_node[1]._M_left - (long)p_Var1;
        local_48.m_block = (void *)((long)&p_Var2->_M_color + (long)&p_Var1->_M_color);
        std::
        _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
        ::_M_insert_unique_<amrex::CArena::Node_const&>
                  ((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                    *)this_00,__pos_00,&local_48);
      }
      std::
      _Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
      ::erase_abi_cxx11_((_Rb_tree<amrex::CArena::Node,amrex::CArena::Node,std::_Identity<amrex::CArena::Node>,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
                          *)this_00,__pos_00);
      goto LAB_00504f05;
    }
    __pos_00._M_node = (_Base_ptr)std::_Rb_tree_increment(__pos_00._M_node);
  } while( true );
}

Assistant:

void*
CArena::alloc (std::size_t nbytes)
{
    std::lock_guard<std::mutex> lock(carena_mutex);

    nbytes = Arena::align(nbytes == 0 ? 1 : nbytes);

    if (static_cast<Long>(m_used+nbytes) >= arena_info.release_threshold) {
        freeUnused_protected();
    }

    //
    // Find node in freelist at lowest memory address that'll satisfy request.
    //
    NL::iterator free_it = m_freelist.begin();

    for ( ; free_it != m_freelist.end(); ++free_it) {
        if ((*free_it).size() >= nbytes) {
            break;
        }
    }

    void* vp = 0;

    if (free_it == m_freelist.end())
    {
        const std::size_t N = nbytes < m_hunk ? m_hunk : nbytes;

        vp = allocate_system(N);

        m_used += N;

        m_alloc.push_back(std::make_pair(vp,N));

        if (nbytes < m_hunk)
        {
            //
            // Add leftover chunk to free list.
            //
            // Insert with a hint -- should be largest block in the set.
            //
            void* block = static_cast<char*>(vp) + nbytes;

            m_freelist.insert(m_freelist.end(), Node(block, vp, m_hunk-nbytes));
        }

        m_busylist.insert(Node(vp, vp, nbytes));
    }
    else
    {
        BL_ASSERT((*free_it).size() >= nbytes);
        BL_ASSERT(m_busylist.find(*free_it) == m_busylist.end());

        vp = (*free_it).block();
        m_busylist.insert(Node(vp, free_it->owner(), nbytes));

        if ((*free_it).size() > nbytes)
        {
            //
            // Insert remainder of free block back into freelist.
            //
            // Insert with a hint -- right after the current block being split.
            //
            Node freeblock = *free_it;

            freeblock.size(freeblock.size() - nbytes);

            freeblock.block(static_cast<char*>(vp) + nbytes);

            m_freelist.insert(free_it, freeblock);
        }

        m_freelist.erase(free_it);
    }

    m_actually_used += nbytes;

    BL_ASSERT(!(vp == 0));

    return vp;
}